

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ui-input.c
# Opt level: O2

ui_event inkey_m(void)

{
  ui_event_type uVar1;
  mouseclick mVar2;
  ulong uVar4;
  undefined4 in_EDX;
  ui_event uVar5;
  mouseclick mVar3;
  
  mVar3.type = EVT_NONE;
  mVar3.x = '\0';
  mVar3.y = '\0';
  mVar3.button = '\0';
  mVar3.mods = '\0';
  uVar4 = 0;
  while ((uVar1 = mVar3.type, 1 < uVar1 - EVT_KBRD && (uVar1 != EVT_BUTTON))) {
    if (uVar1 == EVT_ESCAPE) {
      uVar4 = 0xe00000000001;
      in_EDX = 0;
      goto LAB_001db92f;
    }
    uVar5 = inkey_ex();
    in_EDX = uVar5._8_4_;
    mVar3 = uVar5.mouse;
    uVar4 = (ulong)mVar3 & 0xffffffff00000000;
  }
  mVar2.type = EVT_KBRD;
  mVar2.x = '\0';
  mVar2.y = '\0';
  mVar2.button = '\0';
  mVar2.mods = '\0';
  if (uVar1 != EVT_BUTTON) {
    mVar2 = mVar3;
  }
  uVar4 = uVar4 | (ulong)mVar2 & 0xffffffff;
LAB_001db92f:
  uVar5._8_4_ = in_EDX;
  uVar5._0_4_ = (int)uVar4;
  uVar5._4_1_ = (char)(uVar4 >> 0x20);
  uVar5._5_1_ = (char)(uVar4 >> 0x28);
  uVar5._6_1_ = (char)(uVar4 >> 0x30);
  uVar5._7_1_ = (char)(uVar4 >> 0x38);
  return uVar5;
}

Assistant:

ui_event inkey_m(void)
{
	ui_event ke = EVENT_EMPTY;

	/* Only accept a keypress */
	while (ke.type != EVT_ESCAPE && ke.type != EVT_KBRD	&&
		   ke.type != EVT_MOUSE  && ke.type != EVT_BUTTON)
		ke = inkey_ex();
	if (ke.type == EVT_ESCAPE) {
		ke.type = EVT_KBRD;
		ke.key.code = ESCAPE;
		ke.key.mods = 0;
	} else if (ke.type == EVT_BUTTON) {
		ke.type = EVT_KBRD;
	}

  return ke;
}